

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_page_remove(PageDesc *pd,TranslationBlock_conflict *tb)

{
  ulong uVar1;
  uint local_2c;
  PageDesc *pPStack_28;
  uint n1;
  uintptr_t *pprev;
  TranslationBlock_conflict *tb1;
  TranslationBlock_conflict *tb_local;
  PageDesc *pd_local;
  
  local_2c = (uint)pd->first_tb;
  uVar1 = pd->first_tb;
  pPStack_28 = pd;
  while( true ) {
    pprev = (uintptr_t *)(uVar1 & 0xfffffffffffffffe);
    local_2c = local_2c & 1;
    if (pprev == (uintptr_t *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                 ,0x586,(char *)0x0);
    }
    if ((TranslationBlock_conflict *)pprev == tb) break;
    pPStack_28 = (PageDesc *)(pprev + (ulong)local_2c + 6);
    uVar1 = pprev[(ulong)local_2c + 6];
    local_2c = (uint)uVar1;
  }
  pPStack_28->first_tb = pprev[(ulong)local_2c + 6];
  return;
}

Assistant:

static inline void tb_page_remove(PageDesc *pd, TranslationBlock *tb)
{
    TranslationBlock *tb1;
    uintptr_t *pprev;
    unsigned int n1;

    assert_page_locked(pd);
    pprev = &pd->first_tb;
    PAGE_FOR_EACH_TB(pd, tb1, n1) {
        if (tb1 == tb) {
            *pprev = tb1->page_next[n1];
            return;
        }
        pprev = &tb1->page_next[n1];
    }
    g_assert_not_reached();
}